

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

toml_type_t __thiscall
loltoml::v_0_1_1::detail::parser_t<events_aggregator_t>::parse_date_or_number
          (parser_t<events_aggregator_t> *this)

{
  size_t sVar1;
  events_aggregator_t *this_00;
  char cVar2;
  char cVar3;
  int iVar4;
  parser_error_t *ppVar5;
  size_t sVar6;
  int64_t value;
  ulong uVar7;
  char *pcVar8;
  char *it;
  char *__s1;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  bool bVar12;
  double value_00;
  allocator local_549;
  size_t local_548;
  char *end;
  char local_530 [16];
  size_t local_520;
  string local_518;
  string local_4f8;
  string local_4d8;
  string local_4b8;
  string local_498;
  string local_478;
  string local_458;
  string local_438;
  string local_418;
  string local_3f8;
  string local_3d8;
  string local_3b8;
  string local_398;
  string local_378;
  char buffer [801];
  
  sVar1 = (this->input).m_processed;
  __s1 = buffer + 1;
  buffer[0] = '+';
  cVar2 = input_stream_t::peek(&this->input);
  bVar11 = (int)cVar2 - 0x30U < 10;
  local_548 = sVar1;
  if (bVar11) {
    buffer[1] = input_stream_t::get(&this->input);
    cVar2 = input_stream_t::peek(&this->input);
    if ((int)cVar2 - 0x30U < 10) {
      buffer[2] = input_stream_t::get(&this->input);
      cVar2 = input_stream_t::peek(&this->input);
      if ((int)cVar2 - 0x30U < 10) {
        buffer[3] = input_stream_t::get(&this->input);
        cVar2 = input_stream_t::peek(&this->input);
        if ((int)cVar2 - 0x30U < 10) {
          buffer[4] = input_stream_t::get(&this->input);
          cVar2 = input_stream_t::peek(&this->input);
          if (cVar2 == '-') {
            buffer[5] = input_stream_t::get(&this->input);
            buffer[6] = parse_datetime_digit(this);
            buffer[7] = parse_datetime_digit(this);
            buffer[8] = parse_chars<2ul>(this,(char (*) [2])0x185bd4);
            buffer[9] = parse_datetime_digit(this);
            buffer[10] = parse_datetime_digit(this);
            buffer[0xb] = parse_chars<3ul>(this,(char (*) [3])"tT");
            buffer[0xc] = parse_datetime_digit(this);
            buffer[0xd] = parse_datetime_digit(this);
            buffer[0xe] = parse_chars<2ul>(this,(char (*) [2])0x18decd);
            buffer[0xf] = parse_datetime_digit(this);
            buffer[0x10] = parse_datetime_digit(this);
            buffer[0x11] = parse_chars<2ul>(this,(char (*) [2])0x18decd);
            buffer[0x12] = parse_datetime_digit(this);
            buffer[0x13] = parse_datetime_digit(this);
            cVar2 = input_stream_t::peek(&this->input);
            if (cVar2 == '.') {
              buffer[0x14] = input_stream_t::get(&this->input);
              buffer[0x15] = parse_datetime_digit(this);
              lVar9 = 0x15;
              while (cVar2 = input_stream_t::peek(&this->input), (int)cVar2 - 0x30U < 10) {
                cVar2 = input_stream_t::get(&this->input);
                buffer[lVar9 + 1] = cVar2;
                lVar9 = lVar9 + 1;
              }
            }
            else {
              lVar9 = 0x13;
            }
            cVar2 = input_stream_t::peek(&this->input);
            if ((cVar2 == 'z') || (cVar2 = input_stream_t::peek(&this->input), cVar2 == 'Z')) {
              cVar2 = input_stream_t::get(&this->input);
              buffer[lVar9 + 1] = cVar2;
              lVar9 = lVar9 + 1;
            }
            else {
              cVar2 = parse_chars<3ul>(this,(char (*) [3])"+-");
              buffer[lVar9 + 1] = cVar2;
              cVar2 = parse_datetime_digit(this);
              buffer[lVar9 + 2] = cVar2;
              cVar2 = parse_datetime_digit(this);
              buffer[lVar9 + 3] = cVar2;
              cVar2 = parse_chars<2ul>(this,(char (*) [2])0x18decd);
              buffer[lVar9 + 4] = cVar2;
              cVar2 = parse_datetime_digit(this);
              buffer[lVar9 + 5] = cVar2;
              cVar2 = parse_datetime_digit(this);
              buffer[lVar9 + 6] = cVar2;
              lVar9 = lVar9 + 6;
            }
            this_00 = this->handler;
            end = local_530;
            std::__cxx11::string::_M_construct<char*>((string *)&end,__s1,__s1 + lVar9);
            events_aggregator_t::datetime(this_00,(string *)&end);
            std::__cxx11::string::~string((string *)&end);
            return datetime;
          }
          uVar7 = 4;
        }
        else {
          uVar7 = 3;
        }
      }
      else {
        uVar7 = 2;
      }
    }
    else {
      uVar7 = 1;
    }
  }
  else {
    cVar2 = input_stream_t::peek(&this->input);
    if (cVar2 == '-') {
      input_stream_t::get(&this->input);
      buffer[0] = '-';
    }
    else {
      cVar2 = input_stream_t::peek(&this->input);
      input_stream_t::get(&this->input);
      if (cVar2 != '+') {
        ppVar5 = (parser_error_t *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string((string *)&local_378,"Unexpected character",(allocator *)&end);
        sVar1 = (this->input).m_processed;
        sVar6 = 0;
        if (sVar1 != 0) {
          sVar6 = sVar1 - 1;
        }
        parser_error_t::parser_error_t(ppVar5,&local_378,sVar6);
        __cxa_throw(ppVar5,&parser_error_t::typeinfo,parser_error_t::~parser_error_t);
      }
    }
    uVar7 = 0;
  }
  while( true ) {
    while( true ) {
      if (uVar7 == 800) {
        ppVar5 = (parser_error_t *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string((string *)&local_398,"Number is too long",(allocator *)&end);
        sVar1 = (this->input).m_processed;
        sVar6 = 0;
        if (sVar1 != 0) {
          sVar6 = sVar1 - 1;
        }
        parser_error_t::parser_error_t(ppVar5,&local_398,sVar6);
        __cxa_throw(ppVar5,&parser_error_t::typeinfo,parser_error_t::~parser_error_t);
      }
      cVar2 = input_stream_t::peek(&this->input);
      bVar12 = (int)cVar2 - 0x30U < 10;
      if (!bVar12) break;
      cVar2 = input_stream_t::get(&this->input);
      buffer[uVar7 + 1] = cVar2;
      uVar7 = uVar7 + 1;
      bVar11 = bVar12;
    }
    if (!bVar11) {
      ppVar5 = (parser_error_t *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string((string *)&local_3b8,"Unexpected number end",(allocator *)&end);
      sVar1 = (this->input).m_processed;
      sVar6 = 0;
      if (sVar1 != 0) {
        sVar6 = sVar1 - 1;
      }
      parser_error_t::parser_error_t(ppVar5,&local_3b8,sVar6);
      __cxa_throw(ppVar5,&parser_error_t::typeinfo,parser_error_t::~parser_error_t);
    }
    cVar2 = input_stream_t::peek(&this->input);
    if (cVar2 != '_') break;
    input_stream_t::get(&this->input);
    bVar11 = bVar12;
  }
  if ((1 < uVar7) && (buffer[1] == '0')) {
    ppVar5 = (parser_error_t *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&local_3d8,"Leading zeros are not allowed",(allocator *)&end);
    parser_error_t::parser_error_t(ppVar5,&local_3d8,(this->input).m_processed - uVar7);
    __cxa_throw(ppVar5,&parser_error_t::typeinfo,parser_error_t::~parser_error_t);
  }
  cVar2 = input_stream_t::peek(&this->input);
  if (((cVar2 == '.') || (cVar2 = input_stream_t::peek(&this->input), cVar2 == 'e')) ||
     (cVar2 = input_stream_t::peek(&this->input), cVar2 == 'E')) {
    cVar2 = input_stream_t::peek(&this->input);
    if (cVar2 != '.') {
LAB_00156148:
      cVar2 = input_stream_t::peek(&this->input);
      if ((cVar2 == 'e') || (cVar2 = input_stream_t::peek(&this->input), cVar2 == 'E')) {
        cVar2 = input_stream_t::get(&this->input);
        buffer[uVar7 + 1] = cVar2;
        cVar2 = input_stream_t::peek(&this->input);
        if ((cVar2 == '+') || (cVar2 = input_stream_t::peek(&this->input), cVar2 == '-')) {
          cVar2 = input_stream_t::get(&this->input);
          buffer[uVar7 + 2] = cVar2;
          uVar7 = uVar7 + 2;
        }
        else {
          uVar7 = uVar7 + 1;
        }
        cVar2 = input_stream_t::peek(&this->input);
        local_520 = (this->input).m_processed;
        uVar10 = 0;
        bVar11 = false;
        while( true ) {
          while( true ) {
            if (uVar7 == 800) {
              ppVar5 = (parser_error_t *)__cxa_allocate_exception(0x30);
              std::__cxx11::string::string
                        ((string *)&local_498,"Number is too long",(allocator *)&end);
              sVar1 = (this->input).m_processed;
              sVar6 = 0;
              if (sVar1 != 0) {
                sVar6 = sVar1 - 1;
              }
              parser_error_t::parser_error_t(ppVar5,&local_498,sVar6);
              __cxa_throw(ppVar5,&parser_error_t::typeinfo,parser_error_t::~parser_error_t);
            }
            cVar3 = input_stream_t::peek(&this->input);
            bVar12 = (int)cVar3 - 0x30U < 10;
            if (!bVar12) break;
            cVar3 = input_stream_t::get(&this->input);
            buffer[uVar7 + 1] = cVar3;
            uVar7 = uVar7 + 1;
            uVar10 = uVar10 + 1;
            bVar11 = bVar12;
          }
          if (!bVar11) {
            ppVar5 = (parser_error_t *)__cxa_allocate_exception(0x30);
            std::__cxx11::string::string
                      ((string *)&local_4b8,"Unexpected number end",(allocator *)&end);
            sVar1 = (this->input).m_processed;
            sVar6 = 0;
            if (sVar1 != 0) {
              sVar6 = sVar1 - 1;
            }
            parser_error_t::parser_error_t(ppVar5,&local_4b8,sVar6);
            __cxa_throw(ppVar5,&parser_error_t::typeinfo,parser_error_t::~parser_error_t);
          }
          cVar3 = input_stream_t::peek(&this->input);
          if (cVar3 != '_') break;
          input_stream_t::get(&this->input);
          bVar11 = bVar12;
        }
        if (cVar2 == '0' && 1 < uVar10) {
          ppVar5 = (parser_error_t *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&local_4d8,"Leading zeros are not allowed in exponent",
                     (allocator *)&end);
          parser_error_t::parser_error_t(ppVar5,&local_4d8,local_520);
          __cxa_throw(ppVar5,&parser_error_t::typeinfo,parser_error_t::~parser_error_t);
        }
      }
      buffer[uVar7 + 1] = '\0';
      end = (char *)0x0;
      value_00 = strtod(buffer,&end);
      if (end != __s1 + uVar7) {
        ppVar5 = (parser_error_t *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string((string *)&local_4f8,"Bad number",&local_549);
        parser_error_t::parser_error_t(ppVar5,&local_4f8,local_548);
        __cxa_throw(ppVar5,&parser_error_t::typeinfo,parser_error_t::~parser_error_t);
      }
      if ((ulong)ABS(value_00) < 0x7ff0000000000000) {
        events_aggregator_t::floating_point(this->handler,value_00);
        return floating_point;
      }
      ppVar5 = (parser_error_t *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_518,
                 "The number can not be represented as 64-bit floating point number",&local_549);
      parser_error_t::parser_error_t(ppVar5,&local_518,local_548);
      __cxa_throw(ppVar5,&parser_error_t::typeinfo,parser_error_t::~parser_error_t);
    }
    buffer[uVar7 + 1] = '.';
    input_stream_t::get(&this->input);
    bVar11 = false;
    uVar10 = uVar7;
    do {
      uVar7 = uVar10 + 1;
      bVar12 = bVar11;
      while( true ) {
        if (uVar7 == 800) {
          ppVar5 = (parser_error_t *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string((string *)&local_458,"Number is too long",(allocator *)&end);
          sVar1 = (this->input).m_processed;
          sVar6 = 0;
          if (sVar1 != 0) {
            sVar6 = sVar1 - 1;
          }
          parser_error_t::parser_error_t(ppVar5,&local_458,sVar6);
          __cxa_throw(ppVar5,&parser_error_t::typeinfo,parser_error_t::~parser_error_t);
        }
        cVar2 = input_stream_t::peek(&this->input);
        bVar11 = (int)cVar2 - 0x30U < 10;
        if (bVar11) break;
        if (!bVar12) {
          ppVar5 = (parser_error_t *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&local_478,"Unexpected number end",(allocator *)&end);
          sVar1 = (this->input).m_processed;
          sVar6 = 0;
          if (sVar1 != 0) {
            sVar6 = sVar1 - 1;
          }
          parser_error_t::parser_error_t(ppVar5,&local_478,sVar6);
          __cxa_throw(ppVar5,&parser_error_t::typeinfo,parser_error_t::~parser_error_t);
        }
        cVar2 = input_stream_t::peek(&this->input);
        if (cVar2 != '_') goto LAB_00156148;
        input_stream_t::get(&this->input);
        bVar12 = bVar11;
      }
      cVar2 = input_stream_t::get(&this->input);
      buffer[uVar10 + 2] = cVar2;
      uVar10 = uVar7;
    } while( true );
  }
  if (uVar7 == 0x13) {
    if (buffer[0] == '-') {
      iVar4 = memcmp(__s1,"9223372036854775808",0x13);
      if (0 < iVar4) {
        ppVar5 = (parser_error_t *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)&local_3f8,"The number cannot be represented as 64-bit signed integer",
                   (allocator *)&end);
        parser_error_t::parser_error_t(ppVar5,&local_3f8,local_548);
        __cxa_throw(ppVar5,&parser_error_t::typeinfo,parser_error_t::~parser_error_t);
      }
LAB_0015632f:
      pcVar8 = __s1 + uVar7;
      value = 0;
      for (; __s1 < pcVar8; __s1 = __s1 + 1) {
        value = (value * 10 - (long)*__s1) + 0x30;
      }
      goto LAB_00156386;
    }
    iVar4 = memcmp(__s1,"9223372036854775807",0x13);
    if (0 < iVar4) {
      ppVar5 = (parser_error_t *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_418,"The number cannot be represented as 64-bit signed integer",
                 (allocator *)&end);
      parser_error_t::parser_error_t(ppVar5,&local_418,local_548);
      __cxa_throw(ppVar5,&parser_error_t::typeinfo,parser_error_t::~parser_error_t);
    }
  }
  else {
    if (0x13 < uVar7) {
      ppVar5 = (parser_error_t *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_438,"The number cannot be represented as 64-bit signed integer",
                 (allocator *)&end);
      parser_error_t::parser_error_t(ppVar5,&local_438,local_548);
      __cxa_throw(ppVar5,&parser_error_t::typeinfo,parser_error_t::~parser_error_t);
    }
    if (buffer[0] == '-') goto LAB_0015632f;
  }
  pcVar8 = __s1 + uVar7;
  value = 0;
  for (; __s1 < pcVar8; __s1 = __s1 + 1) {
    value = value * 10 + (long)*__s1 + -0x30;
  }
LAB_00156386:
  events_aggregator_t::integer(this->handler,value);
  return integer;
}

Assistant:

toml_type_t parse_date_or_number() {
        const std::size_t max_int64_digits = 19;
        const char *max_int64_string = "9223372036854775807";
        const char *min_int64_string = "9223372036854775808";

        const std::size_t max_double_length = 800;

        std::size_t value_offset = input.processed();

        char buffer[max_double_length + 1];
        buffer[0] = '+';
        char *digits = buffer + 1;

        std::size_t next_index = 0;

        if (std::isdigit(input.peek())) {
            digits[next_index++] = input.get();
            if (std::isdigit(input.peek())) {
                digits[next_index++] = input.get();
                if (std::isdigit(input.peek())) {
                    digits[next_index++] = input.get();
                    if (std::isdigit(input.peek())) {
                        digits[next_index++] = input.get();

                        if (input.peek() == '-') {
                            digits[next_index++] = input.get();

                            digits[next_index++] = parse_datetime_digit();
                            digits[next_index++] = parse_datetime_digit();
                            digits[next_index++] = parse_chars("-");
                            digits[next_index++] = parse_datetime_digit();
                            digits[next_index++] = parse_datetime_digit();
                            digits[next_index++] = parse_chars("tT");
                            digits[next_index++] = parse_datetime_digit();
                            digits[next_index++] = parse_datetime_digit();
                            digits[next_index++] = parse_chars(":");
                            digits[next_index++] = parse_datetime_digit();
                            digits[next_index++] = parse_datetime_digit();
                            digits[next_index++] = parse_chars(":");
                            digits[next_index++] = parse_datetime_digit();
                            digits[next_index++] = parse_datetime_digit();

                            if (input.peek() == '.') {
                                digits[next_index++] = input.get();
                                digits[next_index++] = parse_datetime_digit();

                                while (std::isdigit(input.peek())) {
                                    digits[next_index++] = input.get();
                                }
                            }

                            if (input.peek() == 'z' || input.peek() == 'Z') {
                                digits[next_index++] = input.get();
                            } else {
                                digits[next_index++] = parse_chars("+-");
                                digits[next_index++] = parse_datetime_digit();
                                digits[next_index++] = parse_datetime_digit();
                                digits[next_index++] = parse_chars(":");
                                digits[next_index++] = parse_datetime_digit();
                                digits[next_index++] = parse_datetime_digit();
                            }

                            handler.datetime(std::string(digits, digits + next_index));
                            return toml_type_t::datetime;
                        }
                    }
                }
            }
        } else if (input.peek() == '-') {
            input.get();
            buffer[0] = '-';
        } else if (input.peek() == '+') {
            input.get();
        } else {
            input.get();
            throw parser_error_t("Unexpected character", last_char_offset());
        }

        bool last_digit = next_index > 0;
        while (true) {
            if (next_index == max_double_length) {
                throw parser_error_t("Number is too long", last_char_offset());
            }

            if (std::isdigit(input.peek())) {
                digits[next_index++] = input.get();
                last_digit = true;
            } else if (last_digit && input.peek() == '_') {
                input.get();
                last_digit = false;
            } else {
                break;
            }
        }

        if (!last_digit) {
            throw parser_error_t("Unexpected number end", last_char_offset());
        }

        if (digits[0] == '0' && next_index > 1) {
            throw parser_error_t("Leading zeros are not allowed", input.processed() - next_index);
        }

        if (input.peek() != '.' && input.peek() != 'e' && input.peek() != 'E') {
            if (next_index == max_int64_digits)
            {
                if (buffer[0] == '-' && strncmp(digits, min_int64_string, max_int64_digits) > 0) {
                    throw parser_error_t("The number cannot be represented as 64-bit signed integer",
                                         value_offset);
                }

                if (buffer[0] != '-' && strncmp(digits, max_int64_string, max_int64_digits) > 0) {
                    throw parser_error_t("The number cannot be represented as 64-bit signed integer",
                                         value_offset);
                }
            } else if (next_index > max_int64_digits) {
                throw parser_error_t("The number cannot be represented as 64-bit signed integer",
                                     value_offset);
            }

            std::int64_t result = 0;

            if (buffer[0] == '-') {
                for (auto it = digits; it < digits + next_index; ++it) {
                    result = 10 * result - (*it - '0');
                }
            } else {
                for (auto it = digits; it < digits + next_index; ++it) {
                    result = 10 * result + (*it - '0');
                }
            }

            handler.integer(result);
            return toml_type_t::integer;
        }

        if (input.peek() == '.') {
            digits[next_index++] = '.';
            input.get();

            last_digit = false;
            while (true) {
                if (next_index == max_double_length) {
                    throw parser_error_t("Number is too long", last_char_offset());
                }

                if (std::isdigit(input.peek())) {
                    digits[next_index++] = input.get();
                    last_digit = true;
                } else if (last_digit && input.peek() == '_') {
                    input.get();
                    last_digit = false;
                } else {
                    break;
                }
            }

            if (!last_digit) {
                throw parser_error_t("Unexpected number end", last_char_offset());
            }
        }

        if (input.peek() == 'e' || input.peek() == 'E') {
            digits[next_index++] = input.get();

            if (input.peek() == '+' || input.peek() == '-') {
                digits[next_index++] = input.get();
            }

            char first_digit = input.peek();
            std::size_t exponent_start = input.processed();
            std::size_t exponent_size = 0;
            last_digit = false;
            while (true) {
                if (next_index == max_double_length) {
                    throw parser_error_t("Number is too long", last_char_offset());
                }

                if (std::isdigit(input.peek())) {
                    digits[next_index++] = input.get();
                    last_digit = true;
                    ++exponent_size;
                } else if (last_digit && input.peek() == '_') {
                    input.get();
                    last_digit = false;
                } else {
                    break;
                }
            }

            if (!last_digit) {
                throw parser_error_t("Unexpected number end", last_char_offset());
            }

            if (exponent_size > 1 && first_digit == '0') {
                throw parser_error_t("Leading zeros are not allowed in exponent", exponent_start);
            }
        }

        digits[next_index] = '\0';
        char *end = nullptr;
        double result = std::strtod(buffer, &end);

        if (end != digits + next_index) {
            throw parser_error_t("Bad number", value_offset);
        }

        if (std::isnan(result) || std::isinf(result)) {
            throw parser_error_t("The number can not be represented as 64-bit floating point number",
                                 value_offset);
        }

        handler.floating_point(result);
        return toml_type_t::floating_point;
    }